

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O0

void __thiscall
JsonArray_NestedError_Test::~JsonArray_NestedError_Test(JsonArray_NestedError_Test *this)

{
  JsonArray_NestedError_Test *this_local;
  
  ~JsonArray_NestedError_Test(this);
  operator_delete(this,0x338);
  return;
}

Assistant:

TEST_F (JsonArray, NestedError) {
    {
        json::parser<json_out_callbacks> p;
        p.input ("[[no"s);
        p.eof ();
        EXPECT_EQ (p.last_error (), make_error_code (json::error_code::unrecognized_token));
    }
    {
        json::parser<json_out_callbacks> p;
        p.input ("[[null"s);
        p.eof ();
        EXPECT_EQ (p.last_error (), make_error_code (json::error_code::expected_array_member));
    }
}